

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::getwalletinfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_ffffffffffffe848;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffe84c;
  undefined8 in_stack_ffffffffffffe850;
  undefined8 in_stack_ffffffffffffe858;
  undefined8 in_stack_ffffffffffffe860;
  _Manager_type in_stack_ffffffffffffe868;
  undefined8 in_stack_ffffffffffffe870;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe878;
  pointer in_stack_ffffffffffffe888;
  pointer pRVar8;
  pointer in_stack_ffffffffffffe890;
  pointer pRVar9;
  pointer in_stack_ffffffffffffe898;
  pointer pRVar10;
  undefined8 in_stack_ffffffffffffe8a0;
  pointer pRVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined8 in_stack_ffffffffffffe8c0;
  pointer pRVar14;
  pointer pRVar15;
  pointer pRVar16;
  undefined8 in_stack_ffffffffffffe8e0;
  pointer pRVar17;
  pointer pRVar18;
  allocator<char> local_16fb;
  allocator<char> local_16fa;
  allocator_type local_16f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16f8;
  allocator<char> local_16da;
  allocator<char> local_16d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16d8;
  allocator<char> local_16ba;
  allocator<char> local_16b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16b8;
  allocator<char> local_169a;
  allocator<char> local_1699;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1698;
  allocator<char> local_167a;
  allocator<char> local_1679;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1678;
  allocator<char> local_165a;
  allocator<char> local_1659;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1658;
  allocator<char> local_163a;
  allocator<char> local_1639;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1638;
  allocator<char> local_1619;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1618;
  allocator<char> local_15f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15f8;
  allocator<char> local_15da;
  allocator<char> local_15d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15d8;
  allocator<char> local_15ba;
  allocator<char> local_15b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15b8;
  allocator<char> local_1599;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1598;
  allocator<char> local_157a;
  allocator<char> local_1579;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1578;
  allocator<char> local_155a;
  allocator<char> local_1559;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1558;
  allocator<char> local_153a;
  allocator<char> local_1539;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1538;
  allocator<char> local_151a;
  allocator<char> local_1519;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1518;
  allocator<char> local_14fa;
  allocator<char> local_14f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14f8;
  allocator<char> local_14da;
  allocator<char> local_14d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14d8;
  allocator<char> local_14b2;
  allocator<char> local_14b1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14b0;
  allocator<char> local_1492;
  allocator<char> local_1491;
  RPCResults local_1490;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1478;
  allocator<char> local_145a;
  allocator<char> local_1459;
  string local_1458;
  string local_1438;
  string local_1418;
  string local_13f8;
  string local_13d8;
  string local_13b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1398;
  char *local_1378;
  size_type local_1370;
  char local_1368 [8];
  undefined8 uStack_1360;
  string local_1358 [32];
  string local_1338 [32];
  string local_1318 [32];
  string local_12f8 [32];
  string local_12d8 [32];
  string local_12b8 [32];
  string local_1298 [32];
  string local_1278 [32];
  string local_1258 [32];
  string local_1238 [32];
  string local_1218 [32];
  string local_11f8 [32];
  RPCResult local_11d8 [2];
  string local_10c8 [32];
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  string local_1048 [24];
  undefined8 local_1030;
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  string local_f88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f48;
  string local_f28 [32];
  string local_f08 [32];
  string local_ee8 [32];
  string local_ec8 [32];
  string local_ea8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  string local_e48 [32];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [32];
  string local_da8 [32];
  string local_d88 [32];
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [32];
  string local_ce8 [32];
  string local_cc8 [32];
  string local_ca8 [32];
  string local_c88 [32];
  RPCResult local_c68 [4];
  RPCResult local_a48;
  RPCResult local_9c0;
  RPCResult local_938;
  RPCResult local_8b0;
  RPCResult local_828;
  RPCResult local_7a0;
  RPCResult local_718;
  RPCResult local_690;
  RPCResult local_608;
  RPCResult local_580;
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  string local_140 [32];
  string local_120 [32];
  RPCResult local_100;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getwalletinfo",&local_1459);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Returns an object containing various wallet state info.\n",&local_145a);
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1478.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_120,"",&local_1491);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"",&local_1492);
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"walletname",&local_14b1);
  std::__cxx11::string::string<std::allocator<char>>(local_ca8,"the wallet name",&local_14b2);
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name._M_string_length = in_stack_ffffffffffffe850;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe860;
  description._M_string_length = in_stack_ffffffffffffe870;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description.field_2 = in_stack_ffffffffffffe878;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffe890;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffe888;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(local_c68,STR,m_key_name,description,inner,SUB81(local_c88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_cc8,"walletversion",&local_14d9);
  std::__cxx11::string::string<std::allocator<char>>(local_ce8,"the wallet version",&local_14da);
  local_14f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_00._M_string_length = in_stack_ffffffffffffe870;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_00.field_2 = in_stack_ffffffffffffe878;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(local_c68 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_cc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"format",&local_14f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d28,"the database format (bdb or sqlite)",&local_14fa);
  local_1518.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1518.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1518.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_01._M_string_length = in_stack_ffffffffffffe870;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_01.field_2 = in_stack_ffffffffffffe878;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(local_c68 + 2,STR,m_key_name_01,description_01,inner_01,SUB81(local_d08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d48,"balance",&local_1519);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d68,"DEPRECATED. Identical to getbalances().mine.trusted",&local_151a);
  local_1538.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1538.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1538.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_02._M_string_length = in_stack_ffffffffffffe870;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_02.field_2 = in_stack_ffffffffffffe878;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (local_c68 + 3,STR_AMOUNT,m_key_name_02,description_02,inner_02,SUB81(local_d48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_d88,"unconfirmed_balance",&local_1539);
  std::__cxx11::string::string<std::allocator<char>>
            (local_da8,"DEPRECATED. Identical to getbalances().mine.untrusted_pending",&local_153a);
  local_1558.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1558.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1558.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_03._M_string_length = in_stack_ffffffffffffe870;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_03.field_2 = in_stack_ffffffffffffe878;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_a48,STR_AMOUNT,m_key_name_03,description_03,inner_03,SUB81(local_d88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_dc8,"immature_balance",&local_1559);
  std::__cxx11::string::string<std::allocator<char>>
            (local_de8,"DEPRECATED. Identical to getbalances().mine.immature",&local_155a);
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_04._M_string_length = in_stack_ffffffffffffe870;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_04.field_2 = in_stack_ffffffffffffe878;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_9c0,STR_AMOUNT,m_key_name_04,description_04,inner_04,SUB81(local_dc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e08,"txcount",&local_1579);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e28,"the total number of transactions in the wallet",&local_157a);
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe848;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_05._M_string_length = in_stack_ffffffffffffe870;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_05.field_2 = in_stack_ffffffffffffe878;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_938,NUM,m_key_name_05,description_05,inner_05,SUB81(local_e08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_e48,"keypoololdest",&local_1599);
  std::operator+(&local_e88,"the ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_e68,&local_e88,
                 " of the oldest pre-generated key in the key pool. Legacy wallets only.");
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  auVar1._4_8_ = in_stack_ffffffffffffe850;
  auVar1._0_4_ = in_stack_ffffffffffffe84c;
  auVar1._12_8_ = in_stack_ffffffffffffe858;
  auVar1._20_8_ = in_stack_ffffffffffffe860;
  auVar1._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe870;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_06.field_2 = in_stack_ffffffffffffe878;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_8b0,NUM_TIME,(string)(auVar1 << 0x20),SUB81(local_e48,0),description_06,inner_06
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_ea8,"keypoolsize",&local_15b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ec8,"how many new keys are pre-generated (only counts external keys)",&local_15ba
            );
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_07._M_string_length = in_stack_ffffffffffffe870;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_07.field_2 = in_stack_ffffffffffffe878;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_828,NUM,m_key_name_06,description_07,inner_07,SUB81(local_ea8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_ee8,"keypoolsize_hd_internal",&local_15d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f08,
             "how many new keys are pre-generated for internal use (used for change outputs, only appears if the wallet is using this feature, otherwise external keys are used)"
             ,&local_15da);
  local_15f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_stack_ffffffffffffe850;
  auVar2._0_4_ = in_stack_ffffffffffffe84c;
  auVar2._12_8_ = in_stack_ffffffffffffe858;
  auVar2._20_8_ = in_stack_ffffffffffffe860;
  auVar2._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe870;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_08.field_2 = in_stack_ffffffffffffe878;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_7a0,NUM,(string)(auVar2 << 0x20),SUB81(local_ee8,0),description_08,inner_08,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_f28,"unlocked_until",&local_15f9);
  std::operator+(&local_f68,"the ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_f48,&local_f68,
                 " until which the wallet is unlocked for transfers, or 0 if the wallet is locked (only present for passphrase-encrypted wallets)"
                );
  local_1618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffe850;
  auVar3._0_4_ = in_stack_ffffffffffffe84c;
  auVar3._12_8_ = in_stack_ffffffffffffe858;
  auVar3._20_8_ = in_stack_ffffffffffffe860;
  auVar3._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffe870;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_09.field_2 = in_stack_ffffffffffffe878;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_718,NUM_TIME,(string)(auVar3 << 0x20),SUB81(local_f28,0),description_09,inner_09
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_f88,"paytxfee",&local_1619);
  std::operator+(&local_fc8,"the transaction fee configuration, set in ",&::CURRENCY_UNIT_abi_cxx11_
                );
  std::operator+(&local_fa8,&local_fc8,"/kvB");
  local_1638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_10._M_string_length = in_stack_ffffffffffffe870;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_10.field_2 = in_stack_ffffffffffffe878;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_690,STR_AMOUNT,m_key_name_07,description_10,inner_10,SUB81(local_f88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_fe8,"hdseedid",&local_1639);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1008,"the Hash160 of the HD seed (only present when HD is enabled)",&local_163a);
  local_1658.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1658.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1658.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  auVar4._4_8_ = in_stack_ffffffffffffe850;
  auVar4._0_4_ = in_stack_ffffffffffffe84c;
  auVar4._12_8_ = in_stack_ffffffffffffe858;
  auVar4._20_8_ = in_stack_ffffffffffffe860;
  auVar4._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffe870;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_11.field_2 = in_stack_ffffffffffffe878;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult
            (&local_608,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_fe8,0),description_11,inner_11,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1028,"private_keys_enabled",&local_1659);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1048,
             "false if privatekeys are disabled for this wallet (enforced watch-only wallet)",
             &local_165a);
  local_1678.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1678.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1678.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_12._M_string_length = in_stack_ffffffffffffe870;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_12.field_2 = in_stack_ffffffffffffe878;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_580,BOOL,m_key_name_08,description_12,inner_12,SUB81(local_1028,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1068,"avoid_reuse",&local_1679);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1088,"whether this wallet tracks clean/dirty coins in terms of reuse",&local_167a
            );
  local_1698.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1698.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1698.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_13._M_string_length = in_stack_ffffffffffffe870;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_13.field_2 = in_stack_ffffffffffffe878;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_4f8,BOOL,m_key_name_09,description_13,inner_13,SUB81(local_1068,0));
  std::__cxx11::string::string<std::allocator<char>>(local_10a8,"scanning",&local_1699);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10c8,"current scanning details, or false if no scan is in progress",&local_169a);
  std::__cxx11::string::string<std::allocator<char>>(local_11f8,"duration",&local_16b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1218,"elapsed seconds since scan start",&local_16ba);
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_14._M_string_length = in_stack_ffffffffffffe870;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_14.field_2 = in_stack_ffffffffffffe878;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(local_11d8,NUM,m_key_name_10,description_14,inner_14,SUB81(local_11f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1238,"progress",&local_16d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1258,"scanning progress percentage [0.0, 1.0]",&local_16da);
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_11._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_15._M_string_length = in_stack_ffffffffffffe870;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_15.field_2 = in_stack_ffffffffffffe878;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(local_11d8 + 1,NUM,m_key_name_11,description_15,inner_15,SUB81(local_1238,0))
  ;
  __l._M_len = 2;
  __l._M_array = local_11d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_16b8,__l,&local_16f9);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_12._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_16._M_string_length = in_stack_ffffffffffffe870;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_16.field_2 = in_stack_ffffffffffffe878;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_470,OBJ,m_key_name_12,description_16,inner_16,SUB81(local_10a8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1278,"descriptors",&local_16fa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1298,"whether this wallet uses descriptors for output script management",
             &local_16fb);
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_13._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_17._M_string_length = in_stack_ffffffffffffe870;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_17.field_2 = in_stack_ffffffffffffe878;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_3e8,BOOL,m_key_name_13,description_17,inner_17,SUB81(local_1278,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_12b8,"external_signer",(allocator<char> *)&stack0xffffffffffffe8e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12d8,
             "whether this wallet is configured to use an external signer such as a hardware wallet"
             ,(allocator<char> *)&stack0xffffffffffffe8e6);
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_14._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_18._M_string_length = in_stack_ffffffffffffe870;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_18.field_2 = in_stack_ffffffffffffe878;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_360,BOOL,m_key_name_14,description_18,inner_18,SUB81(local_12b8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_12f8,"blank",(allocator<char> *)&stack0xffffffffffffe8c7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1318,
             "Whether this wallet intentionally does not contain any keys, scripts, or descriptors",
             (allocator<char> *)&stack0xffffffffffffe8c6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_15._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_19._M_string_length = in_stack_ffffffffffffe870;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_19.field_2 = in_stack_ffffffffffffe878;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe890;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe888;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  RPCResult::RPCResult(&local_2d8,BOOL,m_key_name_15,description_19,inner_19,SUB81(local_12f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1338,"birthtime",(allocator<char> *)&stack0xffffffffffffe8a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1358,
             "The start time for blocks scanning. It could be modified by (re)importing any descriptor with an earlier timestamp."
             ,(allocator<char> *)&stack0xffffffffffffe8a6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  uVar7 = 0;
  auVar5._4_8_ = in_stack_ffffffffffffe850;
  auVar5._0_4_ = in_stack_ffffffffffffe84c;
  auVar5._12_8_ = in_stack_ffffffffffffe858;
  auVar5._20_8_ = in_stack_ffffffffffffe860;
  auVar5._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffe870;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_20.field_2._M_local_buf = in_stack_ffffffffffffe878._M_local_buf;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_250,NUM_TIME,(string)(auVar5 << 0x20),SUB81(local_1338,0),description_20,
             inner_20,true);
  RPCResult::RPCResult(&local_1c8,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_00._M_len = 0x15;
  __l_00._M_array = local_c68;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_14b0,__l_00,(allocator_type *)&stack0xffffffffffffe887);
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe84c;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_16._M_string_length = in_stack_ffffffffffffe850;
  m_key_name_16.field_2._M_allocated_capacity = in_stack_ffffffffffffe858;
  m_key_name_16.field_2._8_8_ = in_stack_ffffffffffffe860;
  description_21._M_string_length = in_stack_ffffffffffffe870;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_21.field_2 = in_stack_ffffffffffffe878;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_16,description_21,inner_21,SUB81(local_120,0));
  result._4_4_ = in_stack_ffffffffffffe84c;
  result.m_type = uVar7;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe850;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe858;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe860;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe868;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe870;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffe878;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe8a0;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffe8c0;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_1490,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13d8,"getwalletinfo",(allocator<char> *)&stack0xffffffffffffe886);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13f8,"",(allocator<char> *)&stack0xffffffffffffe885);
  HelpExampleCli(&local_13b8,&local_13d8,&local_13f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1438,"getwalletinfo",(allocator<char> *)&stack0xffffffffffffe884);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1458,"",(allocator<char> *)&stack0xffffffffffffe883);
  HelpExampleRpc(&local_1418,&local_1438,&local_1458);
  std::operator+(&local_1398,&local_13b8,&local_1418);
  local_1378 = local_1368;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1398._M_dataplus._M_p == &local_1398.field_2) {
    uStack_1360 = local_1398.field_2._8_8_;
  }
  else {
    local_1378 = local_1398._M_dataplus._M_p;
  }
  local_1370 = local_1398._M_string_length;
  local_1398._M_string_length = 0;
  local_1398.field_2._M_local_buf[0] = '\0';
  description_22._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:82:9)>
       ::_M_invoke;
  description_22._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:82:9)>
                ::_M_manager;
  description_22.field_2 = in_stack_ffffffffffffe878;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe8a0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe8c0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = pRVar15;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffe8e0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar16;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar17;
  fun._M_invoker = (_Invoker_type)pRVar18;
  local_1398._M_dataplus._M_p = (pointer)&local_1398.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffe850,&stack0xffffffffffffe858)),
             description_22,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe858);
  std::__cxx11::string::~string((string *)&local_1378);
  std::__cxx11::string::~string((string *)&local_1398);
  std::__cxx11::string::~string((string *)&local_1418);
  std::__cxx11::string::~string((string *)&local_1458);
  std::__cxx11::string::~string((string *)&local_1438);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1490.m_results);
  RPCResult::~RPCResult(&local_100);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14b0);
  lVar6 = 0xaa0;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_c68[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe888);
  std::__cxx11::string::~string(local_1358);
  std::__cxx11::string::~string(local_1338);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8a8);
  std::__cxx11::string::~string(local_1318);
  std::__cxx11::string::~string(local_12f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8c8);
  std::__cxx11::string::~string(local_12d8);
  std::__cxx11::string::~string(local_12b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8e8);
  std::__cxx11::string::~string(local_1298);
  std::__cxx11::string::~string(local_1278);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16b8);
  lVar6 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_11d8[0].m_type + lVar6));
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16f8);
  std::__cxx11::string::~string(local_1258);
  std::__cxx11::string::~string(local_1238);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16d8);
  std::__cxx11::string::~string(local_1218);
  std::__cxx11::string::~string(local_11f8);
  std::__cxx11::string::~string(local_10c8);
  std::__cxx11::string::~string(local_10a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1698);
  std::__cxx11::string::~string(local_1088);
  std::__cxx11::string::~string(local_1068);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1678);
  std::__cxx11::string::~string(local_1048);
  std::__cxx11::string::~string(local_1028);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1658);
  std::__cxx11::string::~string(local_1008);
  std::__cxx11::string::~string(local_fe8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1638);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::~string(local_f88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1618);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string(local_f28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15f8);
  std::__cxx11::string::~string(local_f08);
  std::__cxx11::string::~string(local_ee8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15d8);
  std::__cxx11::string::~string(local_ec8);
  std::__cxx11::string::~string(local_ea8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15b8);
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::~string(local_e48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1598);
  std::__cxx11::string::~string(local_e28);
  std::__cxx11::string::~string(local_e08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1578);
  std::__cxx11::string::~string(local_de8);
  std::__cxx11::string::~string(local_dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1558);
  std::__cxx11::string::~string(local_da8);
  std::__cxx11::string::~string(local_d88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1538);
  std::__cxx11::string::~string(local_d68);
  std::__cxx11::string::~string(local_d48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1518);
  std::__cxx11::string::~string(local_d28);
  std::__cxx11::string::~string(local_d08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14f8);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14d8);
  std::__cxx11::string::~string(local_ca8);
  std::__cxx11::string::~string(local_c88);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1478);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getwalletinfo()
{
    return RPCHelpMan{"getwalletinfo",
                "Returns an object containing various wallet state info.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {
                        {RPCResult::Type::STR, "walletname", "the wallet name"},
                        {RPCResult::Type::NUM, "walletversion", "the wallet version"},
                        {RPCResult::Type::STR, "format", "the database format (bdb or sqlite)"},
                        {RPCResult::Type::STR_AMOUNT, "balance", "DEPRECATED. Identical to getbalances().mine.trusted"},
                        {RPCResult::Type::STR_AMOUNT, "unconfirmed_balance", "DEPRECATED. Identical to getbalances().mine.untrusted_pending"},
                        {RPCResult::Type::STR_AMOUNT, "immature_balance", "DEPRECATED. Identical to getbalances().mine.immature"},
                        {RPCResult::Type::NUM, "txcount", "the total number of transactions in the wallet"},
                        {RPCResult::Type::NUM_TIME, "keypoololdest", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " of the oldest pre-generated key in the key pool. Legacy wallets only."},
                        {RPCResult::Type::NUM, "keypoolsize", "how many new keys are pre-generated (only counts external keys)"},
                        {RPCResult::Type::NUM, "keypoolsize_hd_internal", /*optional=*/true, "how many new keys are pre-generated for internal use (used for change outputs, only appears if the wallet is using this feature, otherwise external keys are used)"},
                        {RPCResult::Type::NUM_TIME, "unlocked_until", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " until which the wallet is unlocked for transfers, or 0 if the wallet is locked (only present for passphrase-encrypted wallets)"},
                        {RPCResult::Type::STR_AMOUNT, "paytxfee", "the transaction fee configuration, set in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "the Hash160 of the HD seed (only present when HD is enabled)"},
                        {RPCResult::Type::BOOL, "private_keys_enabled", "false if privatekeys are disabled for this wallet (enforced watch-only wallet)"},
                        {RPCResult::Type::BOOL, "avoid_reuse", "whether this wallet tracks clean/dirty coins in terms of reuse"},
                        {RPCResult::Type::OBJ, "scanning", "current scanning details, or false if no scan is in progress",
                        {
                            {RPCResult::Type::NUM, "duration", "elapsed seconds since scan start"},
                            {RPCResult::Type::NUM, "progress", "scanning progress percentage [0.0, 1.0]"},
                        }, /*skip_type_check=*/true},
                        {RPCResult::Type::BOOL, "descriptors", "whether this wallet uses descriptors for output script management"},
                        {RPCResult::Type::BOOL, "external_signer", "whether this wallet is configured to use an external signer such as a hardware wallet"},
                        {RPCResult::Type::BOOL, "blank", "Whether this wallet intentionally does not contain any keys, scripts, or descriptors"},
                        {RPCResult::Type::NUM_TIME, "birthtime", /*optional=*/true, "The start time for blocks scanning. It could be modified by (re)importing any descriptor with an earlier timestamp."},
                        RESULT_LAST_PROCESSED_BLOCK,
                    }},
                },
                RPCExamples{
                    HelpExampleCli("getwalletinfo", "")
            + HelpExampleRpc("getwalletinfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue obj(UniValue::VOBJ);

    size_t kpExternalSize = pwallet->KeypoolCountExternalKeys();
    const auto bal = GetBalance(*pwallet);
    obj.pushKV("walletname", pwallet->GetName());
    obj.pushKV("walletversion", pwallet->GetVersion());
    obj.pushKV("format", pwallet->GetDatabase().Format());
    obj.pushKV("balance", ValueFromAmount(bal.m_mine_trusted));
    obj.pushKV("unconfirmed_balance", ValueFromAmount(bal.m_mine_untrusted_pending));
    obj.pushKV("immature_balance", ValueFromAmount(bal.m_mine_immature));
    obj.pushKV("txcount",       (int)pwallet->mapWallet.size());
    const auto kp_oldest = pwallet->GetOldestKeyPoolTime();
    if (kp_oldest.has_value()) {
        obj.pushKV("keypoololdest", kp_oldest.value());
    }
    obj.pushKV("keypoolsize", (int64_t)kpExternalSize);

    LegacyScriptPubKeyMan* spk_man = pwallet->GetLegacyScriptPubKeyMan();
    if (spk_man) {
        CKeyID seed_id = spk_man->GetHDChain().seed_id;
        if (!seed_id.IsNull()) {
            obj.pushKV("hdseedid", seed_id.GetHex());
        }
    }

    if (pwallet->CanSupportFeature(FEATURE_HD_SPLIT)) {
        obj.pushKV("keypoolsize_hd_internal",   (int64_t)(pwallet->GetKeyPoolSize() - kpExternalSize));
    }
    if (pwallet->IsCrypted()) {
        obj.pushKV("unlocked_until", pwallet->nRelockTime);
    }
    obj.pushKV("paytxfee", ValueFromAmount(pwallet->m_pay_tx_fee.GetFeePerK()));
    obj.pushKV("private_keys_enabled", !pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    obj.pushKV("avoid_reuse", pwallet->IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE));
    if (pwallet->IsScanning()) {
        UniValue scanning(UniValue::VOBJ);
        scanning.pushKV("duration", Ticks<std::chrono::seconds>(pwallet->ScanningDuration()));
        scanning.pushKV("progress", pwallet->ScanningProgress());
        obj.pushKV("scanning", std::move(scanning));
    } else {
        obj.pushKV("scanning", false);
    }
    obj.pushKV("descriptors", pwallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    obj.pushKV("external_signer", pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));
    obj.pushKV("blank", pwallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    if (int64_t birthtime = pwallet->GetBirthTime(); birthtime != UNKNOWN_TIME) {
        obj.pushKV("birthtime", birthtime);
    }

    AppendLastProcessedBlock(obj, *pwallet);
    return obj;
},
    };
}